

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Goblin.cpp
# Opt level: O2

void __thiscall Goblin::Defend(Goblin *this,int attackRoll)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = attackRoll / 2;
  if (this->cutOpponentTendon == false) {
    iVar3 = attackRoll;
  }
  iVar2 = (*(this->super_Character)._vptr_Character[1])
                    (this,attackRoll,(long)attackRoll % 2 & 0xffffffff);
  iVar3 = iVar3 - (iVar2 + (this->super_Character).armor);
  if (0 < iVar3) {
    piVar1 = &(this->super_Character).currentStrengthPoints;
    iVar2 = *piVar1;
    *piVar1 = *piVar1 - iVar3;
    if (*piVar1 == 0 || SBORROW4(iVar2,iVar3) != *piVar1 < 0) {
      (this->super_Character).alive = false;
    }
  }
  return;
}

Assistant:

void Goblin::Defend(int attackRoll)
{
    if(cutOpponentTendon)
    {
        attackRoll = (attackRoll / 2);
    }

    int defendRoll = this->RollDefense();
    int damage = attackRoll - defendRoll - armor;

    if(damage > 0)
    {
        currentStrengthPoints -= damage;

        if(currentStrengthPoints <= 0)
        {
            alive = false;
        }
    }
}